

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::LoadBlockIndexDB(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *this_00;
  optional<node::BlockfileCursor> *poVar1;
  bool bVar2;
  long lVar3;
  pointer pCVar4;
  pointer pCVar5;
  BlockTreeDB *this_01;
  bool bVar6;
  _Base_ptr p_Var7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  int nFile;
  long lVar12;
  _Self __tmp;
  long lVar13;
  __node_base *p_Var14;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  FlatFilePos pos;
  int max_blockfile_num;
  bool fReindexing;
  undefined7 uStack_97;
  set<int,_std::less<int>,_std::allocator<int>_> setBlkDataFiles;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = LoadBlockIndex(this,snapshot_blockhash);
  if (bVar6) {
    max_blockfile_num = 0;
    kernel::BlockTreeDB::ReadLastBlockFile
              ((this->m_block_tree_db)._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,&max_blockfile_num)
    ;
    this_00 = &this->m_blockfile_info;
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (this_00,(long)max_blockfile_num + 1);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    logging_function._M_str = "LoadBlockIndexDB";
    logging_function._M_len = 0x10;
    LogPrintFormatInternal<char[17],int>
              (logging_function,source_file,0x1fc,ALL,Info,(ConstevalFormatString<2U>)0xc9db24,
               (char (*) [17])"LoadBlockIndexDB",&max_blockfile_num);
    lVar13 = 0;
    for (lVar12 = 0; lVar12 <= max_blockfile_num; lVar12 = lVar12 + 1) {
      kernel::BlockTreeDB::ReadBlockFileInfo
                ((this->m_block_tree_db)._M_t.
                 super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                 .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,(int)lVar12,
                 (CBlockFileInfo *)
                 ((long)&((this->m_blockfile_info).
                          super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->nBlocks + lVar13));
      lVar13 = lVar13 + 0x28;
    }
    CBlockFileInfo::ToString_abi_cxx11_
              ((string *)&setBlkDataFiles,
               (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
               _M_impl.super__Vector_impl_data._M_start + max_blockfile_num);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x65;
    logging_function_00._M_str = "LoadBlockIndexDB";
    logging_function_00._M_len = 0x10;
    LogPrintFormatInternal<char[17],std::__cxx11::string>
              (logging_function_00,source_file_00,0x200,ALL,Info,(ConstevalFormatString<2U>)0xc9db3e
               ,(char (*) [17])"LoadBlockIndexDB",(string *)&setBlkDataFiles);
    std::__cxx11::string::~string((string *)&setBlkDataFiles);
    iVar9 = max_blockfile_num;
    while( true ) {
      iVar9 = iVar9 + 1;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffff00000000);
      setBlkDataFiles._M_t._M_impl._0_8_ = 0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      bVar6 = kernel::BlockTreeDB::ReadBlockFileInfo
                        ((this->m_block_tree_db)._M_t.
                         super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                         .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,iVar9,
                         (value_type *)&setBlkDataFiles);
      if (!bVar6) break;
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::push_back
                (this_00,(value_type *)&setBlkDataFiles);
    }
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x65;
    logging_function_01._M_str = "LoadBlockIndexDB";
    logging_function_01._M_len = 0x10;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,0x20b,ALL,Info,(ConstevalFormatString<0U>)0xc9db5c
              );
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var14 = &(this->m_block_index)._M_h._M_before_begin;
    setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
      if (((ulong)p_Var14[0x10]._M_nxt & 8) != 0) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &setBlkDataFiles,(int *)((long)&p_Var14[8]._M_nxt + 4));
      }
    }
    for (p_Var7 = setBlkDataFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar6 = (_Rb_tree_header *)p_Var7 == &setBlkDataFiles._M_t._M_impl.super__Rb_tree_header,
        !bVar6; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      pos.nFile = p_Var7[1]._M_color;
      pos.nPos = 0;
      OpenBlockFile((AutoFile *)&fReindexing,this,&pos,true);
      lVar12 = CONCAT71(uStack_97,fReindexing);
      AutoFile::~AutoFile((AutoFile *)&fReindexing);
      if (lVar12 == 0) goto LAB_0075c6a7;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&fReindexing,
               &this->cs_LastBlockFile,"cs_LastBlockFile",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
               ,0x21b,false);
    pCVar4 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar5 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged;
    iVar9 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload._M_value;
    puVar8 = &pCVar4->nHeightLast;
    for (uVar10 = 0; ((long)pCVar5 - (long)pCVar4) / 0x28 != uVar10; uVar10 = uVar10 + 1) {
      bVar11 = iVar9 <= (int)*puVar8 & bVar2;
      poVar1 = (this->m_blockfile_cursors)._M_elems + bVar11;
      if ((this->m_blockfile_cursors)._M_elems[bVar11].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
        (poVar1->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
      }
      (poVar1->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_payload =
           (_Storage<node::BlockfileCursor,_true>)(uVar10 & 0xffffffff);
      puVar8 = puVar8 + 10;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&fReindexing);
    this_01 = (this->m_block_tree_db)._M_t.
              super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>.
              _M_t.
              super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
              .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fReindexing,"prunedblockfiles",(allocator<char> *)&pos);
    kernel::BlockTreeDB::ReadFlag(this_01,(string *)&fReindexing,&this->m_have_pruned);
    std::__cxx11::string::~string((string *)&fReindexing);
    if (this->m_have_pruned == true) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x65;
      logging_function_02._M_str = "LoadBlockIndexDB";
      logging_function_02._M_len = 0x10;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x225,ALL,Info,
                 (ConstevalFormatString<0U>)0xc9db94);
    }
    fReindexing = false;
    kernel::BlockTreeDB::ReadReindexing
              ((this->m_block_tree_db)._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,&fReindexing);
    if (fReindexing == true) {
      LOCK();
      (this->m_blockfiles_indexed)._M_base._M_i = false;
      UNLOCK();
    }
LAB_0075c6a7:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&setBlkDataFiles._M_t);
  }
  else {
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::LoadBlockIndexDB(const std::optional<uint256>& snapshot_blockhash)
{
    if (!LoadBlockIndex(snapshot_blockhash)) {
        return false;
    }
    int max_blockfile_num{0};

    // Load block file info
    m_block_tree_db->ReadLastBlockFile(max_blockfile_num);
    m_blockfile_info.resize(max_blockfile_num + 1);
    LogPrintf("%s: last block file = %i\n", __func__, max_blockfile_num);
    for (int nFile = 0; nFile <= max_blockfile_num; nFile++) {
        m_block_tree_db->ReadBlockFileInfo(nFile, m_blockfile_info[nFile]);
    }
    LogPrintf("%s: last block file info: %s\n", __func__, m_blockfile_info[max_blockfile_num].ToString());
    for (int nFile = max_blockfile_num + 1; true; nFile++) {
        CBlockFileInfo info;
        if (m_block_tree_db->ReadBlockFileInfo(nFile, info)) {
            m_blockfile_info.push_back(info);
        } else {
            break;
        }
    }

    // Check presence of blk files
    LogPrintf("Checking all blk files are present...\n");
    std::set<int> setBlkDataFiles;
    for (const auto& [_, block_index] : m_block_index) {
        if (block_index.nStatus & BLOCK_HAVE_DATA) {
            setBlkDataFiles.insert(block_index.nFile);
        }
    }
    for (std::set<int>::iterator it = setBlkDataFiles.begin(); it != setBlkDataFiles.end(); it++) {
        FlatFilePos pos(*it, 0);
        if (OpenBlockFile(pos, true).IsNull()) {
            return false;
        }
    }

    {
        // Initialize the blockfile cursors.
        LOCK(cs_LastBlockFile);
        for (size_t i = 0; i < m_blockfile_info.size(); ++i) {
            const auto last_height_in_file = m_blockfile_info[i].nHeightLast;
            m_blockfile_cursors[BlockfileTypeForHeight(last_height_in_file)] = {static_cast<int>(i), 0};
        }
    }

    // Check whether we have ever pruned block & undo files
    m_block_tree_db->ReadFlag("prunedblockfiles", m_have_pruned);
    if (m_have_pruned) {
        LogPrintf("LoadBlockIndexDB(): Block files have previously been pruned\n");
    }

    // Check whether we need to continue reindexing
    bool fReindexing = false;
    m_block_tree_db->ReadReindexing(fReindexing);
    if (fReindexing) m_blockfiles_indexed = false;

    return true;
}